

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_valid(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  xmlDocPtr pxVar31;
  long lVar32;
  xmlBufferPtr pxVar33;
  xmlAttrPtr pxVar34;
  xmlNodePtr pxVar35;
  xmlDocPtr pxVar36;
  xmlDocPtr pxVar37;
  undefined4 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int nr;
  int nr_00;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  int extraout_EDX_31;
  int extraout_EDX_32;
  int extraout_EDX_33;
  int extraout_EDX_34;
  int extraout_EDX_35;
  int extraout_EDX_36;
  int test_ret_2;
  undefined8 *puVar41;
  undefined4 *puVar42;
  xmlNodePtr pxVar43;
  int n_dtd;
  uint uVar44;
  int iVar45;
  xmlDtdPtr in_RSI;
  xmlDtdPtr pxVar46;
  xmlNs *pxVar47;
  undefined8 uVar48;
  int n_name;
  undefined8 uVar49;
  int test_ret_1;
  int test_ret_45;
  int n_defaultValue;
  uint uVar50;
  undefined4 uVar51;
  bool bVar52;
  undefined1 auVar53 [12];
  int test_ret;
  int test_ret_3;
  int test_ret_5;
  int test_ret_4;
  int test_ret_7;
  int test_ret_8;
  int test_ret_19;
  int test_ret_40;
  int test_ret_20;
  int test_ret_39;
  
  if (quiet == '\0') {
    puts("Testing valid : 50 of 70 functions ...");
  }
  test_ret_40 = 0;
  _test_ret_8 = 0;
  do {
    uVar44 = 0;
    do {
      uVar7 = 0;
      do {
        uVar6 = 0;
        do {
          uVar5 = 0;
          do {
            uVar29 = 0;
            do {
              uVar1 = (int)uVar29 - 1;
              uVar30 = 0;
              do {
                uVar2 = (int)uVar30 - 1;
                puVar41 = &DAT_00162d68;
                uVar50 = 0;
                do {
                  iVar4 = (int)in_RSI;
                  iVar3 = xmlMemBlocks();
                  if (test_ret_8 == 0) {
                    lVar32 = xmlNewValidCtxt();
                  }
                  else {
                    lVar32 = 0;
                  }
                  in_RSI = gen_xmlDtdPtr(uVar44,iVar4);
                  if (uVar7 < 4) {
                    uVar49 = (&DAT_00162d68)[uVar7];
                  }
                  else {
                    uVar49 = 0;
                  }
                  if (uVar6 < 4) {
                    uVar39 = (&DAT_00162d68)[uVar6];
                  }
                  else {
                    uVar39 = 0;
                  }
                  if (uVar5 < 4) {
                    uVar40 = (&DAT_00162d68)[uVar5];
                  }
                  else {
                    uVar40 = 0;
                  }
                  uVar38 = 0;
                  uVar51 = 0;
                  if (uVar1 < 3) {
                    uVar51 = *(undefined4 *)(&DAT_0015221c + (ulong)uVar1 * 4);
                  }
                  if (uVar2 < 3) {
                    uVar38 = *(undefined4 *)(&DAT_00152204 + (ulong)uVar2 * 4);
                  }
                  if (uVar50 < 4) {
                    uVar48 = *puVar41;
                  }
                  else {
                    uVar48 = 0;
                  }
                  auVar53 = xmlAddAttributeDecl(lVar32,in_RSI,uVar49,uVar39,uVar40,uVar51,uVar38,
                                                uVar48,0);
                  iVar4 = auVar53._8_4_;
                  if (auVar53._0_8_ != 0) {
                    xmlUnlinkNode(auVar53._0_8_);
                    iVar4 = extraout_EDX;
                  }
                  call_tests = call_tests + 1;
                  if (lVar32 != 0) {
                    xmlFreeValidCtxt(lVar32);
                    iVar4 = extraout_EDX_00;
                  }
                  des_xmlDtdPtr(uVar44,in_RSI,iVar4);
                  xmlResetLastError();
                  iVar4 = xmlMemBlocks();
                  if (iVar3 != iVar4) {
                    iVar4 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlAddAttributeDecl",
                           (ulong)(uint)(iVar4 - iVar3));
                    test_ret_40 = test_ret_40 + 1;
                    printf(" %d",_test_ret_8);
                    printf(" %d",(ulong)uVar44);
                    printf(" %d",(ulong)uVar7);
                    printf(" %d",(ulong)uVar6);
                    printf(" %d",(ulong)uVar5);
                    printf(" %d",uVar29);
                    printf(" %d",uVar30);
                    printf(" %d");
                    in_RSI = (xmlDtdPtr)0x0;
                    printf(" %d");
                    putchar(10);
                  }
                  uVar50 = uVar50 + 1;
                  puVar41 = puVar41 + 1;
                } while (uVar50 != 5);
                uVar2 = (int)uVar30 + 1;
                uVar30 = (ulong)uVar2;
              } while (uVar2 != 4);
              uVar1 = (int)uVar29 + 1;
              uVar29 = (ulong)uVar1;
            } while (uVar1 != 4);
            uVar5 = uVar5 + 1;
          } while (uVar5 != 5);
          uVar6 = uVar6 + 1;
        } while (uVar6 != 5);
        uVar7 = uVar7 + 1;
      } while (uVar7 != 5);
      uVar44 = uVar44 + 1;
    } while (uVar44 != 3);
    bVar52 = test_ret_8 == 0;
    _test_ret_8 = (ulong)(test_ret_8 + 1);
  } while (bVar52);
  function_tests = function_tests + 1;
  test_ret = 0;
  _test_ret_3 = 0;
  do {
    uVar44 = 0;
    do {
      uVar29 = 0;
      do {
        uVar7 = 0xffffffff;
        do {
          iVar4 = (int)in_RSI;
          iVar3 = xmlMemBlocks();
          if (test_ret_3 == 0) {
            lVar32 = xmlNewValidCtxt();
          }
          else {
            lVar32 = 0;
          }
          in_RSI = gen_xmlDtdPtr(uVar44,iVar4);
          if ((uint)uVar29 < 4) {
            uVar49 = (&DAT_00162d68)[uVar29];
          }
          else {
            uVar49 = 0;
          }
          uVar51 = 0;
          if (uVar7 < 3) {
            uVar51 = (&DAT_00152210)[uVar7];
          }
          auVar53 = xmlAddElementDecl(lVar32,in_RSI,uVar49,uVar51,0);
          iVar4 = auVar53._8_4_;
          if (auVar53._0_8_ != 0) {
            xmlUnlinkNode(auVar53._0_8_);
            iVar4 = extraout_EDX_01;
          }
          call_tests = call_tests + 1;
          if (lVar32 != 0) {
            xmlFreeValidCtxt(lVar32);
            iVar4 = extraout_EDX_02;
          }
          uVar7 = uVar7 + 1;
          des_xmlDtdPtr(uVar44,in_RSI,iVar4);
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlAddElementDecl",(ulong)(uint)(iVar4 - iVar3));
            test_ret = test_ret + 1;
            printf(" %d",_test_ret_3);
            printf(" %d",(ulong)uVar44);
            printf(" %d",uVar29);
            printf(" %d");
            in_RSI = (xmlDtdPtr)0x0;
            printf(" %d");
            putchar(10);
          }
        } while (uVar7 != 3);
        uVar7 = (uint)uVar29 + 1;
        uVar29 = (ulong)uVar7;
      } while (uVar7 != 5);
      uVar44 = uVar44 + 1;
    } while (uVar44 != 3);
    bVar52 = test_ret_3 == 0;
    _test_ret_3 = (ulong)(test_ret_3 + 1);
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar3 = 0;
  do {
    iVar9 = (int)in_RSI;
    iVar8 = xmlMemBlocks();
    pxVar31 = gen_xmlDocPtr(iVar3,iVar9);
    in_RSI = (xmlDtdPtr)0x0;
    lVar32 = xmlCopyDocElementContent(pxVar31);
    if (lVar32 != 0) {
      xmlFreeElementContent(lVar32);
    }
    call_tests = call_tests + 1;
    if (((pxVar31 != (xmlDocPtr)0x0) && (api_doc != pxVar31)) && (pxVar31->doc != api_doc)) {
      xmlFreeDoc(pxVar31);
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyDocElementContent",(ulong)(uint)(iVar9 - iVar8));
      iVar4 = iVar4 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  lVar32 = xmlCopyElementContent(0);
  if (lVar32 != 0) {
    xmlFreeElementContent(lVar32);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar3 != iVar8) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCopyElementContent");
    in_RSI = (xmlDtdPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar9 = 0;
  iVar45 = 0;
  do {
    iVar11 = (int)in_RSI;
    iVar10 = xmlMemBlocks();
    pxVar33 = gen_xmlBufferPtr(iVar45,iVar11);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpAttributeDecl(pxVar33);
    call_tests = call_tests + 1;
    if (pxVar33 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar33);
    }
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpAttributeDecl",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar45 = iVar45 + 1;
  } while (iVar45 != 3);
  function_tests = function_tests + 1;
  iVar45 = 0;
  iVar10 = 0;
  do {
    iVar12 = (int)in_RSI;
    iVar11 = xmlMemBlocks();
    pxVar33 = gen_xmlBufferPtr(iVar10,iVar12);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpAttributeTable(pxVar33);
    call_tests = call_tests + 1;
    if (pxVar33 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar33);
    }
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpAttributeTable",(ulong)(uint)(iVar12 - iVar11));
      iVar45 = iVar45 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != 3);
  test_ret_5 = (int)(iVar3 != iVar8);
  function_tests = function_tests + 1;
  iVar3 = 0;
  iVar8 = 0;
  do {
    iVar11 = (int)in_RSI;
    iVar10 = xmlMemBlocks();
    pxVar33 = gen_xmlBufferPtr(iVar8,iVar11);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpElementDecl(pxVar33);
    call_tests = call_tests + 1;
    if (pxVar33 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar33);
    }
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpElementDecl",(ulong)(uint)(iVar11 - iVar10));
      iVar3 = iVar3 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 3);
  function_tests = function_tests + 1;
  iVar10 = 0;
  iVar8 = 0;
  do {
    iVar12 = (int)in_RSI;
    iVar11 = xmlMemBlocks();
    pxVar33 = gen_xmlBufferPtr(iVar8,iVar12);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpElementTable(pxVar33);
    call_tests = call_tests + 1;
    if (pxVar33 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar33);
    }
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpElementTable",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 3);
  function_tests = function_tests + 1;
  iVar8 = 0;
  iVar11 = 0;
  do {
    iVar13 = (int)in_RSI;
    iVar12 = xmlMemBlocks();
    pxVar33 = gen_xmlBufferPtr(iVar11,iVar13);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpNotationDecl(pxVar33);
    call_tests = call_tests + 1;
    if (pxVar33 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar33);
    }
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpNotationDecl",(ulong)(uint)(iVar13 - iVar12));
      iVar8 = iVar8 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 3);
  function_tests = function_tests + 1;
  iVar11 = 0;
  iVar12 = 0;
  do {
    iVar14 = (int)in_RSI;
    iVar13 = xmlMemBlocks();
    pxVar33 = gen_xmlBufferPtr(iVar12,iVar14);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpNotationTable(pxVar33);
    call_tests = call_tests + 1;
    if (pxVar33 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar33);
    }
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpNotationTable",(ulong)(uint)(iVar14 - iVar13));
      iVar11 = iVar11 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar12 = iVar12 + 1;
  } while (iVar12 != 3);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar44 = 0;
  do {
    uVar7 = 0;
    do {
      pxVar46 = (xmlDtdPtr)0x0;
      puVar41 = &DAT_00162d68;
      do {
        iVar14 = (int)in_RSI;
        iVar13 = xmlMemBlocks();
        in_RSI = gen_xmlDtdPtr(uVar44,iVar14);
        if (uVar7 < 4) {
          uVar49 = (&DAT_00162d68)[uVar7];
        }
        else {
          uVar49 = 0;
        }
        uVar6 = (uint)pxVar46;
        if (uVar6 < 4) {
          uVar39 = *puVar41;
        }
        else {
          uVar39 = 0;
        }
        auVar53 = xmlGetDtdAttrDesc(in_RSI,uVar49,uVar39);
        iVar14 = auVar53._8_4_;
        if (auVar53._0_8_ != 0) {
          xmlUnlinkNode(auVar53._0_8_);
          iVar14 = extraout_EDX_03;
        }
        call_tests = call_tests + 1;
        des_xmlDtdPtr(uVar44,in_RSI,iVar14);
        xmlResetLastError();
        iVar14 = xmlMemBlocks();
        if (iVar13 != iVar14) {
          iVar14 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlGetDtdAttrDesc",(ulong)(uint)(iVar14 - iVar13));
          iVar12 = iVar12 + 1;
          printf(" %d",(ulong)uVar44);
          printf(" %d",(ulong)uVar7);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar46;
        }
        uVar6 = uVar6 + 1;
        pxVar46 = (xmlDtdPtr)(ulong)uVar6;
        puVar41 = puVar41 + 1;
      } while (uVar6 != 5);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 5);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 3);
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar44 = 0;
  do {
    puVar41 = &DAT_00162d68;
    uVar7 = 0;
    do {
      iVar15 = (int)in_RSI;
      iVar14 = xmlMemBlocks();
      in_RSI = gen_xmlDtdPtr(uVar44,iVar15);
      if (uVar7 < 4) {
        uVar49 = *puVar41;
      }
      else {
        uVar49 = 0;
      }
      auVar53 = xmlGetDtdElementDesc(in_RSI,uVar49);
      iVar15 = auVar53._8_4_;
      if (auVar53._0_8_ != 0) {
        xmlUnlinkNode(auVar53._0_8_);
        iVar15 = extraout_EDX_04;
      }
      call_tests = call_tests + 1;
      des_xmlDtdPtr(uVar44,in_RSI,iVar15);
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetDtdElementDesc",(ulong)(uint)(iVar15 - iVar14));
        iVar13 = iVar13 + 1;
        printf(" %d",(ulong)uVar44);
        in_RSI = (xmlDtdPtr)(ulong)uVar7;
        printf(" %d");
        putchar(10);
      }
      uVar7 = uVar7 + 1;
      puVar41 = puVar41 + 1;
    } while (uVar7 != 5);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 3);
  function_tests = function_tests + 1;
  iVar14 = 0;
  uVar44 = 0;
  do {
    uVar7 = 0;
    do {
      uVar6 = 0;
      do {
        puVar41 = &DAT_00162d68;
        pxVar46 = (xmlDtdPtr)0x0;
        do {
          iVar16 = (int)in_RSI;
          iVar15 = xmlMemBlocks();
          in_RSI = gen_xmlDtdPtr(uVar44,iVar16);
          if (uVar7 < 4) {
            uVar49 = (&DAT_00162d68)[uVar7];
          }
          else {
            uVar49 = 0;
          }
          if (uVar6 < 4) {
            uVar39 = (&DAT_00162d68)[uVar6];
          }
          else {
            uVar39 = 0;
          }
          uVar5 = (uint)pxVar46;
          if (uVar5 < 4) {
            uVar40 = *puVar41;
          }
          else {
            uVar40 = 0;
          }
          auVar53 = xmlGetDtdQAttrDesc(in_RSI,uVar49,uVar39,uVar40);
          iVar16 = auVar53._8_4_;
          if (auVar53._0_8_ != 0) {
            xmlUnlinkNode(auVar53._0_8_);
            iVar16 = extraout_EDX_05;
          }
          call_tests = call_tests + 1;
          des_xmlDtdPtr(uVar44,in_RSI,iVar16);
          xmlResetLastError();
          iVar16 = xmlMemBlocks();
          if (iVar15 != iVar16) {
            iVar16 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlGetDtdQAttrDesc",(ulong)(uint)(iVar16 - iVar15));
            iVar14 = iVar14 + 1;
            printf(" %d",(ulong)uVar44);
            printf(" %d",(ulong)uVar7);
            printf(" %d",(ulong)uVar6);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar46;
          }
          uVar5 = uVar5 + 1;
          pxVar46 = (xmlDtdPtr)(ulong)uVar5;
          puVar41 = puVar41 + 1;
        } while (uVar5 != 5);
        uVar6 = uVar6 + 1;
      } while (uVar6 != 5);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 5);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 3);
  function_tests = function_tests + 1;
  test_ret_3 = 0;
  uVar44 = 0;
  do {
    uVar7 = 0;
    do {
      pxVar46 = (xmlDtdPtr)0x0;
      puVar41 = &DAT_00162d68;
      do {
        iVar16 = (int)in_RSI;
        iVar15 = xmlMemBlocks();
        in_RSI = gen_xmlDtdPtr(uVar44,iVar16);
        if (uVar7 < 4) {
          uVar49 = (&DAT_00162d68)[uVar7];
        }
        else {
          uVar49 = 0;
        }
        uVar6 = (uint)pxVar46;
        if (uVar6 < 4) {
          uVar39 = *puVar41;
        }
        else {
          uVar39 = 0;
        }
        auVar53 = xmlGetDtdQElementDesc(in_RSI,uVar49,uVar39);
        iVar16 = auVar53._8_4_;
        if (auVar53._0_8_ != 0) {
          xmlUnlinkNode(auVar53._0_8_);
          iVar16 = extraout_EDX_06;
        }
        call_tests = call_tests + 1;
        des_xmlDtdPtr(uVar44,in_RSI,iVar16);
        xmlResetLastError();
        iVar16 = xmlMemBlocks();
        if (iVar15 != iVar16) {
          iVar16 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlGetDtdQElementDesc",(ulong)(uint)(iVar16 - iVar15));
          test_ret_3 = test_ret_3 + 1;
          printf(" %d",(ulong)uVar44);
          printf(" %d",(ulong)uVar7);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar46;
        }
        uVar6 = uVar6 + 1;
        pxVar46 = (xmlDtdPtr)(ulong)uVar6;
        puVar41 = puVar41 + 1;
      } while (uVar6 != 5);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 5);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 3);
  function_tests = function_tests + 1;
  iVar15 = 0;
  uVar44 = 0;
  do {
    puVar41 = &DAT_00162d68;
    uVar7 = 0;
    do {
      iVar17 = (int)in_RSI;
      iVar16 = xmlMemBlocks();
      pxVar31 = gen_xmlDocPtr(uVar44,iVar17);
      if (uVar7 < 4) {
        in_RSI = (xmlDtdPtr)*puVar41;
      }
      else {
        in_RSI = (xmlDtdPtr)0x0;
      }
      lVar32 = xmlGetID(pxVar31);
      if (lVar32 != 0) {
        xmlUnlinkNode(lVar32);
        xmlFreeNode(lVar32);
      }
      call_tests = call_tests + 1;
      if (((pxVar31 != (xmlDocPtr)0x0) && (api_doc != pxVar31)) && (pxVar31->doc != api_doc)) {
        xmlFreeDoc(pxVar31);
      }
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar16 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetID",(ulong)(uint)(iVar17 - iVar16));
        iVar15 = iVar15 + 1;
        printf(" %d",(ulong)uVar44);
        in_RSI = (xmlDtdPtr)(ulong)uVar7;
        printf(" %d");
        putchar(10);
      }
      uVar7 = uVar7 + 1;
      puVar41 = puVar41 + 1;
    } while (uVar7 != 5);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  iVar16 = 0;
  uVar44 = 0;
  do {
    uVar7 = 0;
    do {
      pxVar46 = (xmlDtdPtr)0x0;
      do {
        iVar17 = (int)in_RSI;
        iVar18 = xmlMemBlocks();
        pxVar31 = gen_xmlDocPtr(uVar44,iVar17);
        in_RSI = (xmlDtdPtr)gen_xmlNodePtr(uVar7,iVar17);
        iVar19 = (int)pxVar46;
        pxVar34 = gen_xmlAttrPtr(iVar19,iVar17);
        xmlIsID(pxVar31,in_RSI,pxVar34);
        call_tests = call_tests + 1;
        iVar17 = extraout_EDX_07;
        if (((pxVar31 != (xmlDocPtr)0x0) && (api_doc != pxVar31)) && (pxVar31->doc != api_doc)) {
          xmlFreeDoc(pxVar31);
          iVar17 = extraout_EDX_08;
        }
        des_xmlNodePtr(uVar7,(xmlNodePtr)in_RSI,iVar17);
        if (iVar19 == 0) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar17 = xmlMemBlocks();
        if (iVar18 != iVar17) {
          iVar17 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsID",(ulong)(uint)(iVar17 - iVar18));
          iVar16 = iVar16 + 1;
          printf(" %d",(ulong)uVar44);
          printf(" %d",(ulong)uVar7);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar46;
        }
        pxVar46 = (xmlDtdPtr)(ulong)(iVar19 + 1U);
      } while (iVar19 + 1U == 1);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  iVar3 = test_ret + test_ret_40 + iVar4 + test_ret_5 + iVar9 + iVar45 + iVar3 + iVar10 + iVar8 +
          iVar11 + iVar12 + iVar13 + iVar14 + test_ret_3;
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar44 = 0;
  do {
    puVar41 = &DAT_00162d68;
    uVar7 = 0;
    do {
      iVar9 = (int)in_RSI;
      iVar8 = xmlMemBlocks();
      pxVar31 = gen_xmlDocPtr(uVar44,iVar9);
      if (uVar7 < 4) {
        in_RSI = (xmlDtdPtr)*puVar41;
      }
      else {
        in_RSI = (xmlDtdPtr)0x0;
      }
      xmlIsMixedElement(pxVar31);
      call_tests = call_tests + 1;
      if (((pxVar31 != (xmlDocPtr)0x0) && (api_doc != pxVar31)) && (pxVar31->doc != api_doc)) {
        xmlFreeDoc(pxVar31);
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIsMixedElement",(ulong)(uint)(iVar9 - iVar8));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar44);
        in_RSI = (xmlDtdPtr)(ulong)uVar7;
        printf(" %d");
        putchar(10);
      }
      uVar7 = uVar7 + 1;
      puVar41 = puVar41 + 1;
    } while (uVar7 != 5);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  test_ret_3 = 0;
  uVar44 = 0;
  do {
    uVar7 = 0;
    do {
      pxVar46 = (xmlDtdPtr)0x0;
      do {
        iVar8 = (int)in_RSI;
        iVar9 = xmlMemBlocks();
        pxVar31 = gen_xmlDocPtr(uVar44,iVar8);
        in_RSI = (xmlDtdPtr)gen_xmlNodePtr(uVar7,iVar8);
        iVar45 = (int)pxVar46;
        pxVar34 = gen_xmlAttrPtr(iVar45,iVar8);
        xmlIsRef(pxVar31,in_RSI,pxVar34);
        call_tests = call_tests + 1;
        iVar8 = extraout_EDX_09;
        if (((pxVar31 != (xmlDocPtr)0x0) && (api_doc != pxVar31)) && (pxVar31->doc != api_doc)) {
          xmlFreeDoc(pxVar31);
          iVar8 = extraout_EDX_10;
        }
        des_xmlNodePtr(uVar7,(xmlNodePtr)in_RSI,iVar8);
        if (iVar45 == 0) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar9 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsRef",(ulong)(uint)(iVar8 - iVar9));
          test_ret_3 = test_ret_3 + 1;
          printf(" %d",(ulong)uVar44);
          printf(" %d",(ulong)uVar7);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar46;
        }
        pxVar46 = (xmlDtdPtr)(ulong)(iVar45 + 1U);
      } while (iVar45 + 1U == 1);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar44 = 0;
  do {
    uVar7 = 0;
    do {
      uVar6 = 0xffffffff;
      do {
        iVar45 = (int)in_RSI;
        iVar9 = xmlMemBlocks();
        pxVar31 = gen_xmlDocPtr(uVar44,iVar45);
        if (uVar7 < 4) {
          uVar49 = (&DAT_00162d68)[uVar7];
        }
        else {
          uVar49 = 0;
        }
        uVar51 = 0;
        if (uVar6 < 3) {
          uVar51 = (&DAT_00152210)[uVar6];
        }
        in_RSI = (xmlDtdPtr)xmlNewDocElementContent(pxVar31,uVar49,uVar51);
        xmlFreeDocElementContent(pxVar31);
        call_tests = call_tests + 1;
        if (((pxVar31 != (xmlDocPtr)0x0) && (api_doc != pxVar31)) && (pxVar31->doc != api_doc)) {
          xmlFreeDoc(pxVar31);
        }
        uVar6 = uVar6 + 1;
        xmlResetLastError();
        iVar45 = xmlMemBlocks();
        if (iVar9 != iVar45) {
          iVar45 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocElementContent",(ulong)(uint)(iVar45 - iVar9))
          ;
          iVar8 = iVar8 + 1;
          printf(" %d",(ulong)uVar44);
          printf(" %d",(ulong)uVar7);
          in_RSI = (xmlDtdPtr)(ulong)uVar6;
          printf(" %d");
          putchar(10);
        }
      } while (uVar6 != 3);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 5);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar44 = 0;
  do {
    uVar7 = 0xffffffff;
    do {
      iVar45 = xmlMemBlocks();
      if (uVar44 < 4) {
        uVar49 = (&DAT_00162d68)[uVar44];
      }
      else {
        uVar49 = 0;
      }
      pxVar34 = (xmlAttrPtr)0x0;
      if (uVar7 < 3) {
        pxVar34 = (xmlAttrPtr)(ulong)(uint)(&DAT_00152210)[uVar7];
      }
      lVar32 = xmlNewElementContent(uVar49);
      if (lVar32 != 0) {
        xmlFreeElementContent();
      }
      uVar7 = uVar7 + 1;
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar45 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewElementContent",(ulong)(uint)(iVar10 - iVar45));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar44);
        pxVar34 = (xmlAttrPtr)(ulong)uVar7;
        printf(" %d");
        putchar(10);
      }
    } while (uVar7 != 3);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 5);
  iVar3 = iVar3 + iVar15 + iVar16 + iVar4 + test_ret_3;
  function_tests = function_tests + 1;
  test_ret_3 = 0;
  uVar44 = 0;
  do {
    uVar7 = 0;
    do {
      iVar45 = (int)pxVar34;
      iVar4 = xmlMemBlocks();
      pxVar31 = gen_xmlDocPtr(uVar44,iVar45);
      pxVar34 = gen_xmlAttrPtr(uVar7,iVar45);
      xmlRemoveID(pxVar31);
      call_tests = call_tests + 1;
      if (((pxVar31 != (xmlDocPtr)0x0) && (api_doc != pxVar31)) && (pxVar31->doc != api_doc)) {
        xmlFreeDoc(pxVar31);
      }
      if (uVar7 == 0) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar45 = xmlMemBlocks();
      if (iVar4 != iVar45) {
        iVar45 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRemoveID",(ulong)(uint)(iVar45 - iVar4));
        test_ret_3 = test_ret_3 + 1;
        printf(" %d",(ulong)uVar44);
        pxVar34 = (xmlAttrPtr)(ulong)uVar7;
        printf(" %d");
        putchar(10);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 == 1);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar44 = 0;
  do {
    uVar7 = 0;
    do {
      iVar10 = (int)pxVar34;
      iVar45 = xmlMemBlocks();
      pxVar31 = gen_xmlDocPtr(uVar44,iVar10);
      pxVar34 = gen_xmlAttrPtr(uVar7,iVar10);
      xmlRemoveRef(pxVar31);
      call_tests = call_tests + 1;
      if (((pxVar31 != (xmlDocPtr)0x0) && (api_doc != pxVar31)) && (pxVar31->doc != api_doc)) {
        xmlFreeDoc(pxVar31);
      }
      if (uVar7 == 0) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar45 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRemoveRef",(ulong)(uint)(iVar10 - iVar45));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar44);
        pxVar34 = (xmlAttrPtr)(ulong)uVar7;
        printf(" %d");
        putchar(10);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 == 1);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  iVar45 = 0;
  uVar44 = 0;
  do {
    puVar42 = &DAT_0015fd28;
    uVar7 = 0;
    do {
      iVar10 = xmlMemBlocks();
      uVar38 = 0xffffffff;
      uVar51 = 0xffffffff;
      if (uVar44 < 4) {
        uVar51 = (&DAT_0015fd28)[uVar44];
      }
      if (uVar7 < 4) {
        uVar38 = *puVar42;
      }
      xmlSnprintfElementContent(0,uVar51,0,uVar38);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSnprintfElementContent",(ulong)(uint)(iVar11 - iVar10)
              );
        iVar45 = iVar45 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar44);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      uVar7 = uVar7 + 1;
      puVar42 = puVar42 + 1;
    } while (uVar7 != 4);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  puVar42 = &DAT_0015fd28;
  uVar44 = 0;
  test_ret_19 = 0;
  do {
    iVar10 = xmlMemBlocks();
    uVar51 = 0xffffffff;
    if (uVar44 < 4) {
      uVar51 = *puVar42;
    }
    xmlSprintfElementContent(0,0,uVar51);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSprintfElementContent",(ulong)(uint)(iVar11 - iVar10));
      test_ret_19 = test_ret_19 + 1;
      printf(" %d",0);
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
    puVar42 = puVar42 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  iVar10 = 0;
  iVar11 = 0;
  do {
    iVar12 = xmlMemBlocks();
    if (iVar11 == 0) {
      lVar32 = xmlNewValidCtxt();
    }
    else {
      lVar32 = 0;
    }
    pxVar35 = (xmlNodePtr)0x0;
    xmlValidBuildContentModel(lVar32);
    call_tests = call_tests + 1;
    if (lVar32 != 0) {
      xmlFreeValidCtxt(lVar32);
    }
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlValidBuildContentModel",(ulong)(uint)(iVar13 - iVar12));
      iVar10 = iVar10 + 1;
      printf(" %d");
      pxVar35 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 == 1);
  function_tests = function_tests + 1;
  iVar11 = 0;
  _test_ret_7 = 0;
  do {
    uVar44 = 0;
    do {
      iVar12 = 0;
      do {
        uVar29 = 0;
        do {
          pxVar43 = (xmlNodePtr)0x0;
          puVar41 = &DAT_00162d68;
          do {
            iVar14 = (int)pxVar35;
            iVar13 = xmlMemBlocks();
            if (test_ret_7 == 0) {
              lVar32 = xmlNewValidCtxt();
            }
            else {
              lVar32 = 0;
            }
            pxVar31 = gen_xmlDocPtr(uVar44,iVar14);
            pxVar35 = gen_xmlNodePtr(iVar12,iVar14);
            if ((uint)uVar29 < 4) {
              uVar49 = (&DAT_00162d68)[uVar29];
            }
            else {
              uVar49 = 0;
            }
            uVar7 = (uint)pxVar43;
            if (uVar7 < 4) {
              uVar39 = *puVar41;
            }
            else {
              uVar39 = 0;
            }
            auVar53 = xmlValidCtxtNormalizeAttributeValue(lVar32,pxVar31,pxVar35,uVar49,uVar39);
            iVar14 = auVar53._8_4_;
            if (auVar53._0_8_ != 0) {
              (*_xmlFree)(auVar53._0_8_);
              iVar14 = extraout_EDX_11;
            }
            call_tests = call_tests + 1;
            if (lVar32 != 0) {
              xmlFreeValidCtxt(lVar32);
              iVar14 = extraout_EDX_12;
            }
            if (((pxVar31 != (xmlDocPtr)0x0) && (api_doc != pxVar31)) && (pxVar31->doc != api_doc))
            {
              xmlFreeDoc(pxVar31);
              iVar14 = extraout_EDX_13;
            }
            des_xmlNodePtr(iVar12,pxVar35,iVar14);
            xmlResetLastError();
            iVar14 = xmlMemBlocks();
            if (iVar13 != iVar14) {
              iVar14 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlValidCtxtNormalizeAttributeValue",
                     (ulong)(uint)(iVar14 - iVar13));
              iVar11 = iVar11 + 1;
              printf(" %d",_test_ret_7);
              printf(" %d",(ulong)uVar44);
              printf(" %d",iVar12);
              printf(" %d",uVar29);
              printf(" %d");
              putchar(10);
              pxVar35 = pxVar43;
            }
            uVar7 = uVar7 + 1;
            pxVar43 = (xmlNodePtr)(ulong)uVar7;
            puVar41 = puVar41 + 1;
          } while (uVar7 != 5);
          uVar7 = (uint)uVar29 + 1;
          uVar29 = (ulong)uVar7;
        } while (uVar7 != 5);
        iVar12 = iVar12 + 1;
      } while (iVar12 != 3);
      uVar44 = uVar44 + 1;
    } while (uVar44 != 4);
    bVar52 = test_ret_7 == 0;
    _test_ret_7 = (ulong)(test_ret_7 + 1);
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar3 = iVar3 + iVar8 + iVar9 + test_ret_3 + iVar4 + iVar45 + test_ret_19;
  test_ret_19 = 0;
  uVar44 = 0;
  do {
    uVar49 = 0;
    if (uVar44 == 0) {
      uVar49 = 0x1658d8;
    }
    puVar42 = &DAT_0015fd28;
    uVar7 = 0;
    do {
      iVar4 = xmlMemBlocks();
      uVar51 = 0xffffffff;
      if (uVar7 < 4) {
        uVar51 = *puVar42;
      }
      pxVar31 = (xmlDocPtr)0x0;
      xmlValidGetPotentialChildren(0,0,uVar49,uVar51);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar4 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidGetPotentialChildren",
               (ulong)(uint)(iVar8 - iVar4));
        test_ret_19 = test_ret_19 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar44);
        pxVar31 = (xmlDocPtr)(ulong)uVar7;
        printf(" %d");
        putchar(10);
      }
      uVar7 = uVar7 + 1;
      puVar42 = puVar42 + 1;
    } while (uVar7 != 4);
    bVar52 = uVar44 == 0;
    uVar44 = uVar44 + 1;
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar44 = 0;
  do {
    iVar8 = 0;
    do {
      pxVar36 = (xmlDocPtr)0x0;
      do {
        iVar45 = (int)pxVar31;
        iVar9 = xmlMemBlocks();
        pxVar35 = gen_xmlNodePtr(uVar44,iVar45);
        pxVar31 = (xmlDocPtr)gen_xmlNodePtr(iVar8,iVar45);
        iVar12 = (int)pxVar36;
        xmlValidGetValidElements(pxVar35,pxVar31,0);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar44,pxVar35,nr);
        des_xmlNodePtr(iVar8,(xmlNodePtr)pxVar31,nr_00);
        xmlResetLastError();
        iVar45 = xmlMemBlocks();
        if (iVar9 != iVar45) {
          iVar45 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidGetValidElements",(ulong)(uint)(iVar45 - iVar9)
                );
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar44);
          printf(" %d",iVar8);
          printf(" %d",0);
          printf(" %d");
          putchar(10);
          pxVar31 = pxVar36;
        }
        uVar7 = iVar12 + 1;
        pxVar36 = (xmlDocPtr)(ulong)uVar7;
      } while (uVar7 != 4);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 3);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 3);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar44 = 0;
  do {
    uVar7 = 0;
    do {
      uVar6 = 0;
      do {
        puVar41 = &DAT_00162d68;
        uVar5 = 0;
        do {
          iVar45 = (int)pxVar31;
          iVar9 = xmlMemBlocks();
          pxVar36 = gen_xmlDocPtr(uVar44,iVar45);
          pxVar31 = (xmlDocPtr)gen_xmlNodePtr(uVar7,iVar45);
          if (uVar6 < 4) {
            uVar49 = (&DAT_00162d68)[uVar6];
          }
          else {
            uVar49 = 0;
          }
          if (uVar5 < 4) {
            uVar39 = *puVar41;
          }
          else {
            uVar39 = 0;
          }
          auVar53 = xmlValidNormalizeAttributeValue(pxVar36,pxVar31,uVar49,uVar39);
          iVar45 = auVar53._8_4_;
          if (auVar53._0_8_ != 0) {
            (*_xmlFree)(auVar53._0_8_);
            iVar45 = extraout_EDX_14;
          }
          call_tests = call_tests + 1;
          if (((pxVar36 != (xmlDocPtr)0x0) && (api_doc != pxVar36)) && (pxVar36->doc != api_doc)) {
            xmlFreeDoc(pxVar36);
            iVar45 = extraout_EDX_15;
          }
          des_xmlNodePtr(uVar7,(xmlNodePtr)pxVar31,iVar45);
          xmlResetLastError();
          iVar45 = xmlMemBlocks();
          if (iVar9 != iVar45) {
            iVar45 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidNormalizeAttributeValue",
                   (ulong)(uint)(iVar45 - iVar9));
            iVar8 = iVar8 + 1;
            printf(" %d",(ulong)uVar44);
            printf(" %d",(ulong)uVar7);
            printf(" %d",(ulong)uVar6);
            pxVar31 = (xmlDocPtr)(ulong)uVar5;
            printf(" %d");
            putchar(10);
          }
          uVar5 = uVar5 + 1;
          puVar41 = puVar41 + 1;
        } while (uVar5 != 5);
        uVar6 = uVar6 + 1;
      } while (uVar6 != 5);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  iVar9 = iVar3 + iVar10 + iVar11 + test_ret_19;
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar44 = 0;
  do {
    iVar45 = 0;
    do {
      iVar11 = (int)pxVar31;
      iVar10 = xmlMemBlocks();
      if (uVar44 == 0) {
        lVar32 = xmlNewValidCtxt();
      }
      else {
        lVar32 = 0;
      }
      pxVar36 = gen_xmlDocPtr(iVar45,iVar11);
      pxVar31 = pxVar36;
      xmlValidateAttributeDecl(lVar32,pxVar36,0);
      call_tests = call_tests + 1;
      if (lVar32 != 0) {
        xmlFreeValidCtxt(lVar32);
      }
      if (((pxVar36 != (xmlDocPtr)0x0) && (api_doc != pxVar36)) && (pxVar36->doc != api_doc)) {
        xmlFreeDoc(pxVar36);
      }
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateAttributeDecl",(ulong)(uint)(iVar11 - iVar10))
        ;
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar44);
        printf(" %d");
        pxVar31 = (xmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
      iVar45 = iVar45 + 1;
    } while (iVar45 != 4);
    bVar52 = uVar44 == 0;
    uVar44 = uVar44 + 1;
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar45 = 0;
  uVar44 = 0;
  do {
    puVar41 = &DAT_00162d68;
    uVar7 = 0;
    do {
      iVar10 = xmlMemBlocks();
      uVar51 = 0;
      if (uVar44 - 1 < 3) {
        uVar51 = *(undefined4 *)(&DAT_0015221c + (ulong)(uVar44 - 1) * 4);
      }
      if (uVar7 < 4) {
        pxVar31 = (xmlDocPtr)*puVar41;
      }
      else {
        pxVar31 = (xmlDocPtr)0x0;
      }
      xmlValidateAttributeValue(uVar51);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateAttributeValue",(ulong)(uint)(iVar11 - iVar10)
              );
        iVar45 = iVar45 + 1;
        printf(" %d",(ulong)uVar44);
        pxVar31 = (xmlDocPtr)(ulong)uVar7;
        printf(" %d");
        putchar(10);
      }
      uVar7 = uVar7 + 1;
      puVar41 = puVar41 + 1;
    } while (uVar7 != 5);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  iVar10 = 0;
  uVar44 = 0;
  do {
    uVar7 = 0;
    do {
      iVar12 = (int)pxVar31;
      iVar11 = xmlMemBlocks();
      if (uVar44 == 0) {
        lVar32 = xmlNewValidCtxt();
      }
      else {
        lVar32 = 0;
      }
      pxVar36 = gen_xmlDocPtr(uVar7,iVar12);
      pxVar31 = pxVar36;
      xmlValidateDocument(lVar32);
      call_tests = call_tests + 1;
      if (lVar32 != 0) {
        xmlFreeValidCtxt(lVar32);
      }
      if (((pxVar36 != (xmlDocPtr)0x0) && (api_doc != pxVar36)) && (pxVar36->doc != api_doc)) {
        xmlFreeDoc(pxVar36);
      }
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar11 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateDocument",(ulong)(uint)(iVar12 - iVar11));
        iVar10 = iVar10 + 1;
        printf(" %d",(ulong)uVar44);
        pxVar31 = (xmlDocPtr)(ulong)uVar7;
        printf(" %d");
        putchar(10);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 4);
    bVar52 = uVar44 == 0;
    uVar44 = uVar44 + 1;
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar29 = 0;
  do {
    uVar44 = 0;
    do {
      iVar13 = (int)pxVar31;
      iVar12 = xmlMemBlocks();
      iVar14 = (int)uVar29;
      if (iVar14 == 0) {
        lVar32 = xmlNewValidCtxt();
      }
      else {
        lVar32 = 0;
      }
      pxVar36 = gen_xmlDocPtr(uVar44,iVar13);
      pxVar31 = pxVar36;
      xmlValidateDocumentFinal(lVar32);
      call_tests = call_tests + 1;
      if (lVar32 != 0) {
        xmlFreeValidCtxt(lVar32);
      }
      if (((pxVar36 != (xmlDocPtr)0x0) && (api_doc != pxVar36)) && (pxVar36->doc != api_doc)) {
        xmlFreeDoc(pxVar36);
      }
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar12 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateDocumentFinal",(ulong)(uint)(iVar13 - iVar12))
        ;
        iVar11 = iVar11 + 1;
        printf(" %d",uVar29);
        pxVar31 = (xmlDocPtr)(ulong)uVar44;
        printf(" %d");
        putchar(10);
      }
      uVar44 = uVar44 + 1;
    } while (uVar44 != 4);
    uVar29 = (ulong)(iVar14 + 1);
  } while (iVar14 == 0);
  function_tests = function_tests + 1;
  iVar12 = 0;
  _test_ret_3 = 0;
  do {
    uVar44 = 0;
    do {
      pxVar36 = (xmlDocPtr)0x0;
      do {
        iVar14 = (int)pxVar31;
        iVar13 = xmlMemBlocks();
        if (test_ret_3 == 0) {
          lVar32 = xmlNewValidCtxt();
        }
        else {
          lVar32 = 0;
        }
        pxVar37 = gen_xmlDocPtr(uVar44,iVar14);
        iVar15 = (int)pxVar36;
        pxVar31 = (xmlDocPtr)gen_xmlDtdPtr(iVar15,iVar14);
        xmlValidateDtd(lVar32,pxVar37,pxVar31);
        call_tests = call_tests + 1;
        iVar14 = extraout_EDX_16;
        if (lVar32 != 0) {
          xmlFreeValidCtxt(lVar32);
          iVar14 = extraout_EDX_17;
        }
        if (((pxVar37 != (xmlDocPtr)0x0) && (api_doc != pxVar37)) && (pxVar37->doc != api_doc)) {
          xmlFreeDoc(pxVar37);
          iVar14 = extraout_EDX_18;
        }
        des_xmlDtdPtr(iVar15,(xmlDtdPtr)pxVar31,iVar14);
        xmlResetLastError();
        iVar14 = xmlMemBlocks();
        if (iVar13 != iVar14) {
          iVar14 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidateDtd",(ulong)(uint)(iVar14 - iVar13));
          iVar12 = iVar12 + 1;
          printf(" %d",_test_ret_3);
          printf(" %d",(ulong)uVar44);
          printf(" %d");
          putchar(10);
          pxVar31 = pxVar36;
        }
        pxVar36 = (xmlDocPtr)(ulong)(iVar15 + 1U);
      } while (iVar15 + 1U != 3);
      uVar44 = uVar44 + 1;
    } while (uVar44 != 4);
    bVar52 = test_ret_3 == 0;
    _test_ret_3 = (ulong)(test_ret_3 + 1);
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar29 = 0;
  do {
    uVar44 = 0;
    do {
      iVar15 = (int)pxVar31;
      iVar14 = xmlMemBlocks();
      iVar16 = (int)uVar29;
      if (iVar16 == 0) {
        lVar32 = xmlNewValidCtxt();
      }
      else {
        lVar32 = 0;
      }
      pxVar36 = gen_xmlDocPtr(uVar44,iVar15);
      pxVar31 = pxVar36;
      xmlValidateDtdFinal(lVar32);
      call_tests = call_tests + 1;
      if (lVar32 != 0) {
        xmlFreeValidCtxt(lVar32);
      }
      if (((pxVar36 != (xmlDocPtr)0x0) && (api_doc != pxVar36)) && (pxVar36->doc != api_doc)) {
        xmlFreeDoc(pxVar36);
      }
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateDtdFinal",(ulong)(uint)(iVar15 - iVar14));
        iVar13 = iVar13 + 1;
        printf(" %d",uVar29);
        pxVar31 = (xmlDocPtr)(ulong)uVar44;
        printf(" %d");
        putchar(10);
      }
      uVar44 = uVar44 + 1;
    } while (uVar44 != 4);
    uVar29 = (ulong)(iVar16 + 1);
  } while (iVar16 == 0);
  function_tests = function_tests + 1;
  iVar14 = 0;
  _test_ret_3 = 0;
  do {
    uVar44 = 0;
    do {
      pxVar36 = (xmlDocPtr)0x0;
      do {
        iVar16 = (int)pxVar31;
        iVar15 = xmlMemBlocks();
        if (test_ret_3 == 0) {
          lVar32 = xmlNewValidCtxt();
        }
        else {
          lVar32 = 0;
        }
        pxVar37 = gen_xmlDocPtr(uVar44,iVar16);
        iVar17 = (int)pxVar36;
        pxVar31 = (xmlDocPtr)gen_xmlNodePtr(iVar17,iVar16);
        xmlValidateElement(lVar32,pxVar37,pxVar31);
        call_tests = call_tests + 1;
        iVar16 = extraout_EDX_19;
        if (lVar32 != 0) {
          xmlFreeValidCtxt(lVar32);
          iVar16 = extraout_EDX_20;
        }
        if (((pxVar37 != (xmlDocPtr)0x0) && (api_doc != pxVar37)) && (pxVar37->doc != api_doc)) {
          xmlFreeDoc(pxVar37);
          iVar16 = extraout_EDX_21;
        }
        des_xmlNodePtr(iVar17,(xmlNodePtr)pxVar31,iVar16);
        xmlResetLastError();
        iVar16 = xmlMemBlocks();
        if (iVar15 != iVar16) {
          iVar16 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidateElement",(ulong)(uint)(iVar16 - iVar15));
          iVar14 = iVar14 + 1;
          printf(" %d",_test_ret_3);
          printf(" %d",(ulong)uVar44);
          printf(" %d");
          putchar(10);
          pxVar31 = pxVar36;
        }
        pxVar36 = (xmlDocPtr)(ulong)(iVar17 + 1U);
      } while (iVar17 + 1U != 3);
      uVar44 = uVar44 + 1;
    } while (uVar44 != 4);
    bVar52 = test_ret_3 == 0;
    _test_ret_3 = (ulong)(test_ret_3 + 1);
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar15 = 0;
  uVar44 = 0;
  do {
    iVar16 = 0;
    do {
      iVar18 = (int)pxVar31;
      iVar17 = xmlMemBlocks();
      if (uVar44 == 0) {
        lVar32 = xmlNewValidCtxt();
      }
      else {
        lVar32 = 0;
      }
      pxVar36 = gen_xmlDocPtr(iVar16,iVar18);
      pxVar31 = pxVar36;
      xmlValidateElementDecl(lVar32,pxVar36,0);
      call_tests = call_tests + 1;
      if (lVar32 != 0) {
        xmlFreeValidCtxt(lVar32);
      }
      if (((pxVar36 != (xmlDocPtr)0x0) && (api_doc != pxVar36)) && (pxVar36->doc != api_doc)) {
        xmlFreeDoc(pxVar36);
      }
      xmlResetLastError();
      iVar18 = xmlMemBlocks();
      if (iVar17 != iVar18) {
        iVar18 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateElementDecl",(ulong)(uint)(iVar18 - iVar17));
        iVar15 = iVar15 + 1;
        printf(" %d",(ulong)uVar44);
        printf(" %d");
        pxVar31 = (xmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 != 4);
    bVar52 = uVar44 == 0;
    uVar44 = uVar44 + 1;
  } while (bVar52);
  function_tests = function_tests + 1;
  puVar41 = &DAT_00162d68;
  uVar44 = 0;
  iVar16 = 0;
  do {
    iVar17 = xmlMemBlocks();
    if (uVar44 < 4) {
      uVar49 = *puVar41;
    }
    else {
      uVar49 = 0;
    }
    xmlValidateNameValue(uVar49);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlValidateNameValue",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      pxVar31 = (xmlDocPtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
    puVar41 = puVar41 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  puVar41 = &DAT_00162d68;
  uVar44 = 0;
  iVar17 = 0;
  do {
    iVar18 = xmlMemBlocks();
    if (uVar44 < 4) {
      uVar49 = *puVar41;
    }
    else {
      uVar49 = 0;
    }
    xmlValidateNamesValue(uVar49);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlValidateNamesValue",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      pxVar31 = (xmlDocPtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
    puVar41 = puVar41 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  puVar41 = &DAT_00162d68;
  uVar44 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    if (uVar44 < 4) {
      uVar49 = *puVar41;
    }
    else {
      uVar49 = 0;
    }
    xmlValidateNmtokenValue(uVar49);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlValidateNmtokenValue",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      pxVar31 = (xmlDocPtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
    puVar41 = puVar41 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  puVar41 = &DAT_00162d68;
  uVar44 = 0;
  iVar19 = 0;
  do {
    iVar20 = xmlMemBlocks();
    if (uVar44 < 4) {
      uVar49 = *puVar41;
    }
    else {
      uVar49 = 0;
    }
    xmlValidateNmtokensValue(uVar49);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlValidateNmtokensValue",(ulong)(uint)(iVar21 - iVar20));
      iVar19 = iVar19 + 1;
      pxVar31 = (xmlDocPtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
    puVar41 = puVar41 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  test_ret_19 = 0;
  uVar44 = 0;
  do {
    iVar20 = 0;
    do {
      iVar22 = (int)pxVar31;
      iVar21 = xmlMemBlocks();
      if (uVar44 == 0) {
        lVar32 = xmlNewValidCtxt();
      }
      else {
        lVar32 = 0;
      }
      pxVar36 = gen_xmlDocPtr(iVar20,iVar22);
      pxVar31 = pxVar36;
      xmlValidateNotationDecl(lVar32,pxVar36,0);
      call_tests = call_tests + 1;
      if (lVar32 != 0) {
        xmlFreeValidCtxt(lVar32);
      }
      if (((pxVar36 != (xmlDocPtr)0x0) && (api_doc != pxVar36)) && (pxVar36->doc != api_doc)) {
        xmlFreeDoc(pxVar36);
      }
      xmlResetLastError();
      iVar22 = xmlMemBlocks();
      if (iVar21 != iVar22) {
        iVar22 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateNotationDecl",(ulong)(uint)(iVar22 - iVar21));
        test_ret_19 = test_ret_19 + 1;
        printf(" %d",(ulong)uVar44);
        printf(" %d");
        pxVar31 = (xmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
      iVar20 = iVar20 + 1;
    } while (iVar20 != 4);
    bVar52 = uVar44 == 0;
    uVar44 = uVar44 + 1;
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar20 = 0;
  _test_ret_3 = 0;
  do {
    uVar44 = 0;
    do {
      pxVar36 = (xmlDocPtr)0x0;
      puVar41 = &DAT_00162d68;
      do {
        iVar22 = (int)pxVar31;
        iVar21 = xmlMemBlocks();
        if (test_ret_3 == 0) {
          lVar32 = xmlNewValidCtxt();
        }
        else {
          lVar32 = 0;
        }
        pxVar37 = gen_xmlDocPtr(uVar44,iVar22);
        uVar7 = (uint)pxVar36;
        if (uVar7 < 4) {
          uVar49 = *puVar41;
        }
        else {
          uVar49 = 0;
        }
        pxVar31 = pxVar37;
        xmlValidateNotationUse(lVar32,pxVar37,uVar49);
        call_tests = call_tests + 1;
        if (lVar32 != 0) {
          xmlFreeValidCtxt(lVar32);
        }
        if (((pxVar37 != (xmlDocPtr)0x0) && (api_doc != pxVar37)) && (pxVar37->doc != api_doc)) {
          xmlFreeDoc(pxVar37);
        }
        xmlResetLastError();
        iVar22 = xmlMemBlocks();
        if (iVar21 != iVar22) {
          iVar22 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidateNotationUse",(ulong)(uint)(iVar22 - iVar21))
          ;
          iVar20 = iVar20 + 1;
          printf(" %d",_test_ret_3);
          printf(" %d",(ulong)uVar44);
          printf(" %d");
          putchar(10);
          pxVar31 = pxVar36;
        }
        uVar7 = uVar7 + 1;
        pxVar36 = (xmlDocPtr)(ulong)uVar7;
        puVar41 = puVar41 + 1;
      } while (uVar7 != 5);
      uVar44 = uVar44 + 1;
    } while (uVar44 != 4);
    bVar52 = test_ret_3 == 0;
    _test_ret_3 = (ulong)(test_ret_3 + 1);
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar21 = 0;
  _test_ret_7 = 0;
  do {
    uVar44 = 0;
    do {
      uVar7 = 0;
      do {
        _test_ret_3 = 0;
        do {
          pxVar36 = (xmlDocPtr)0x0;
          puVar41 = &DAT_00162d68;
          do {
            iVar23 = (int)pxVar31;
            iVar22 = xmlMemBlocks();
            if (test_ret_7 == 0) {
              lVar32 = xmlNewValidCtxt();
            }
            else {
              lVar32 = 0;
            }
            pxVar37 = gen_xmlDocPtr(uVar44,iVar23);
            pxVar31 = (xmlDocPtr)gen_xmlNodePtr(uVar7,iVar23);
            iVar24 = (int)_test_ret_3;
            pxVar34 = gen_xmlAttrPtr(iVar24,iVar23);
            uVar6 = (uint)pxVar36;
            if (uVar6 < 4) {
              uVar49 = *puVar41;
            }
            else {
              uVar49 = 0;
            }
            xmlValidateOneAttribute(lVar32,pxVar37,pxVar31,pxVar34,uVar49);
            call_tests = call_tests + 1;
            iVar23 = extraout_EDX_22;
            if (lVar32 != 0) {
              xmlFreeValidCtxt(lVar32);
              iVar23 = extraout_EDX_23;
            }
            if (((pxVar37 != (xmlDocPtr)0x0) && (api_doc != pxVar37)) && (pxVar37->doc != api_doc))
            {
              xmlFreeDoc(pxVar37);
              iVar23 = extraout_EDX_24;
            }
            des_xmlNodePtr(uVar7,(xmlNodePtr)pxVar31,iVar23);
            if (iVar24 == 0) {
              xmlFreeDoc(api_doc);
              api_doc = (xmlDocPtr)0x0;
              api_dtd = (xmlDtdPtr)0x0;
              api_root = (xmlNodePtr)0x0;
              api_ns = (xmlNsPtr)0x0;
            }
            xmlResetLastError();
            iVar23 = xmlMemBlocks();
            if (iVar22 != iVar23) {
              iVar23 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlValidateOneAttribute",
                     (ulong)(uint)(iVar23 - iVar22));
              iVar21 = iVar21 + 1;
              printf(" %d",_test_ret_7);
              printf(" %d",(ulong)uVar44);
              printf(" %d",(ulong)uVar7);
              printf(" %d",_test_ret_3);
              printf(" %d");
              putchar(10);
              pxVar31 = pxVar36;
            }
            uVar6 = uVar6 + 1;
            pxVar36 = (xmlDocPtr)(ulong)uVar6;
            puVar41 = puVar41 + 1;
          } while (uVar6 != 5);
          _test_ret_3 = (ulong)(iVar24 + 1);
        } while (iVar24 == 0);
        uVar7 = uVar7 + 1;
      } while (uVar7 != 3);
      uVar44 = uVar44 + 1;
    } while (uVar44 != 4);
    bVar52 = test_ret_7 == 0;
    _test_ret_7 = (ulong)(test_ret_7 + 1);
  } while (bVar52);
  function_tests = function_tests + 1;
  test_ret_40 = 0;
  _test_ret_3 = 0;
  do {
    uVar44 = 0;
    do {
      pxVar36 = (xmlDocPtr)0x0;
      do {
        iVar23 = (int)pxVar31;
        iVar22 = xmlMemBlocks();
        if (test_ret_3 == 0) {
          lVar32 = xmlNewValidCtxt();
        }
        else {
          lVar32 = 0;
        }
        pxVar37 = gen_xmlDocPtr(uVar44,iVar23);
        iVar24 = (int)pxVar36;
        pxVar31 = (xmlDocPtr)gen_xmlNodePtr(iVar24,iVar23);
        xmlValidateOneElement(lVar32,pxVar37,pxVar31);
        call_tests = call_tests + 1;
        iVar23 = extraout_EDX_25;
        if (lVar32 != 0) {
          xmlFreeValidCtxt(lVar32);
          iVar23 = extraout_EDX_26;
        }
        if (((pxVar37 != (xmlDocPtr)0x0) && (api_doc != pxVar37)) && (pxVar37->doc != api_doc)) {
          xmlFreeDoc(pxVar37);
          iVar23 = extraout_EDX_27;
        }
        des_xmlNodePtr(iVar24,(xmlNodePtr)pxVar31,iVar23);
        xmlResetLastError();
        iVar23 = xmlMemBlocks();
        if (iVar22 != iVar23) {
          iVar23 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidateOneElement",(ulong)(uint)(iVar23 - iVar22));
          test_ret_40 = test_ret_40 + 1;
          printf(" %d",_test_ret_3);
          printf(" %d",(ulong)uVar44);
          printf(" %d");
          putchar(10);
          pxVar31 = pxVar36;
        }
        pxVar36 = (xmlDocPtr)(ulong)(iVar24 + 1U);
      } while (iVar24 + 1U != 3);
      uVar44 = uVar44 + 1;
    } while (uVar44 != 4);
    bVar52 = test_ret_3 == 0;
    _test_ret_3 = (ulong)(test_ret_3 + 1);
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar22 = 0;
  _test_ret_8 = 0;
  do {
    uVar44 = 0;
    do {
      iVar23 = 0;
      do {
        uVar7 = 0;
        do {
          _test_ret_3 = 0;
          do {
            puVar41 = &DAT_00162d68;
            pxVar36 = (xmlDocPtr)0x0;
            do {
              iVar25 = (int)pxVar31;
              iVar24 = xmlMemBlocks();
              if (test_ret_8 == 0) {
                lVar32 = xmlNewValidCtxt();
              }
              else {
                lVar32 = 0;
              }
              pxVar37 = gen_xmlDocPtr(uVar44,iVar25);
              pxVar31 = (xmlDocPtr)gen_xmlNodePtr(iVar23,iVar25);
              if (uVar7 < 4) {
                uVar49 = (&DAT_00162d68)[uVar7];
              }
              else {
                uVar49 = 0;
              }
              if (test_ret_3 == 0) {
                get_api_root();
                pxVar47 = api_ns;
                if (api_root != (xmlNodePtr)0x0) {
                  pxVar47 = api_root->nsDef;
                  api_ns = pxVar47;
                }
              }
              else {
                pxVar47 = (xmlNs *)0x0;
              }
              uVar6 = (uint)pxVar36;
              if (uVar6 < 4) {
                uVar39 = *puVar41;
              }
              else {
                uVar39 = 0;
              }
              xmlValidateOneNamespace(lVar32,pxVar37,pxVar31,uVar49,pxVar47,uVar39);
              call_tests = call_tests + 1;
              iVar25 = extraout_EDX_28;
              if (lVar32 != 0) {
                xmlFreeValidCtxt(lVar32);
                iVar25 = extraout_EDX_29;
              }
              if (((pxVar37 != (xmlDocPtr)0x0) && (api_doc != pxVar37)) && (pxVar37->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar37);
                iVar25 = extraout_EDX_30;
              }
              des_xmlNodePtr(iVar23,(xmlNodePtr)pxVar31,iVar25);
              if (test_ret_3 == 0) {
                xmlFreeDoc(api_doc);
                api_doc = (xmlDocPtr)0x0;
                api_dtd = (xmlDtdPtr)0x0;
                api_root = (xmlNodePtr)0x0;
                api_ns = (xmlNsPtr)0x0;
              }
              xmlResetLastError();
              iVar25 = xmlMemBlocks();
              if (iVar24 != iVar25) {
                iVar25 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlValidateOneNamespace",
                       (ulong)(uint)(iVar25 - iVar24));
                iVar22 = iVar22 + 1;
                printf(" %d",_test_ret_8);
                printf(" %d",(ulong)uVar44);
                printf(" %d",iVar23);
                printf(" %d",(ulong)uVar7);
                printf(" %d",_test_ret_3);
                printf(" %d");
                putchar(10);
                pxVar31 = pxVar36;
              }
              uVar6 = uVar6 + 1;
              pxVar36 = (xmlDocPtr)(ulong)uVar6;
              puVar41 = puVar41 + 1;
            } while (uVar6 != 5);
            bVar52 = test_ret_3 == 0;
            _test_ret_3 = (ulong)(test_ret_3 + 1);
          } while (bVar52);
          uVar7 = uVar7 + 1;
        } while (uVar7 != 5);
        iVar23 = iVar23 + 1;
      } while (iVar23 != 3);
      uVar44 = uVar44 + 1;
    } while (uVar44 != 4);
    bVar52 = test_ret_8 == 0;
    _test_ret_8 = (ulong)(test_ret_8 + 1);
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar23 = 0;
  _test_ret_4 = 0;
  do {
    uVar44 = 0;
    do {
      uVar29 = 0;
      do {
        puVar41 = &DAT_00162d68;
        pxVar36 = (xmlDocPtr)0x0;
        do {
          iVar25 = (int)pxVar31;
          iVar24 = xmlMemBlocks();
          if (test_ret_4 == 0) {
            lVar32 = xmlNewValidCtxt();
          }
          else {
            lVar32 = 0;
          }
          pxVar37 = gen_xmlDocPtr(uVar44,iVar25);
          iVar26 = (int)uVar29;
          pxVar31 = (xmlDocPtr)gen_xmlNodePtr(iVar26,iVar25);
          uVar7 = (uint)pxVar36;
          if (uVar7 < 4) {
            uVar49 = *puVar41;
          }
          else {
            uVar49 = 0;
          }
          xmlValidatePopElement(lVar32,pxVar37,pxVar31,uVar49);
          call_tests = call_tests + 1;
          iVar25 = extraout_EDX_31;
          if (lVar32 != 0) {
            xmlFreeValidCtxt(lVar32);
            iVar25 = extraout_EDX_32;
          }
          if (((pxVar37 != (xmlDocPtr)0x0) && (api_doc != pxVar37)) && (pxVar37->doc != api_doc)) {
            xmlFreeDoc(pxVar37);
            iVar25 = extraout_EDX_33;
          }
          des_xmlNodePtr(iVar26,(xmlNodePtr)pxVar31,iVar25);
          xmlResetLastError();
          iVar25 = xmlMemBlocks();
          if (iVar24 != iVar25) {
            iVar25 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidatePopElement",(ulong)(uint)(iVar25 - iVar24)
                  );
            iVar23 = iVar23 + 1;
            printf(" %d",_test_ret_4);
            printf(" %d",(ulong)uVar44);
            printf(" %d",uVar29);
            printf(" %d");
            putchar(10);
            pxVar31 = pxVar36;
          }
          uVar7 = uVar7 + 1;
          pxVar36 = (xmlDocPtr)(ulong)uVar7;
          puVar41 = puVar41 + 1;
        } while (uVar7 != 5);
        uVar29 = (ulong)(iVar26 + 1U);
      } while (iVar26 + 1U != 3);
      uVar44 = uVar44 + 1;
    } while (uVar44 != 4);
    bVar52 = test_ret_4 == 0;
    _test_ret_4 = (ulong)(test_ret_4 + 1);
  } while (bVar52);
  function_tests = function_tests + 1;
  iVar24 = 0;
  _test_ret_3 = 0;
  do {
    uVar29 = 0;
    do {
      pxVar31 = (xmlDocPtr)0x0;
      puVar42 = &DAT_0015fd28;
      do {
        iVar25 = xmlMemBlocks();
        if (test_ret_3 == 0) {
          lVar32 = xmlNewValidCtxt();
        }
        else {
          lVar32 = 0;
        }
        if ((uint)uVar29 < 4) {
          iVar3 = (*(code *)(&DAT_00152118 + *(int *)(&DAT_00152118 + uVar29 * 4)))();
          return iVar3;
        }
        pxVar36 = (xmlDocPtr)0x0;
        uVar51 = 0xffffffff;
        uVar44 = (uint)pxVar31;
        if (uVar44 < 4) {
          uVar51 = *puVar42;
        }
        xmlValidatePushCData(lVar32,0,uVar51);
        call_tests = call_tests + 1;
        if (lVar32 != 0) {
          xmlFreeValidCtxt(lVar32);
        }
        xmlResetLastError();
        iVar26 = xmlMemBlocks();
        if (iVar25 != iVar26) {
          iVar26 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidatePushCData",(ulong)(uint)(iVar26 - iVar25));
          iVar24 = iVar24 + 1;
          printf(" %d",_test_ret_3);
          printf(" %d",uVar29);
          printf(" %d");
          putchar(10);
          pxVar36 = pxVar31;
        }
        uVar44 = uVar44 + 1;
        pxVar31 = (xmlDocPtr)(ulong)uVar44;
        puVar42 = puVar42 + 1;
      } while (uVar44 != 4);
      uVar44 = (uint)uVar29 + 1;
      uVar29 = (ulong)uVar44;
    } while (uVar44 != 5);
    bVar52 = test_ret_3 != 0;
    _test_ret_3 = (ulong)(test_ret_3 + 1);
    if (bVar52) {
      function_tests = function_tests + 1;
      iVar25 = 0;
      _test_ret_4 = 0;
      do {
        uVar44 = 0;
        do {
          uVar29 = 0;
          do {
            puVar41 = &DAT_00162d68;
            pxVar31 = (xmlDocPtr)0x0;
            do {
              iVar27 = (int)pxVar36;
              iVar26 = xmlMemBlocks();
              if (test_ret_4 == 0) {
                lVar32 = xmlNewValidCtxt();
              }
              else {
                lVar32 = 0;
              }
              pxVar37 = gen_xmlDocPtr(uVar44,iVar27);
              iVar28 = (int)uVar29;
              pxVar36 = (xmlDocPtr)gen_xmlNodePtr(iVar28,iVar27);
              uVar7 = (uint)pxVar31;
              if (uVar7 < 4) {
                uVar49 = *puVar41;
              }
              else {
                uVar49 = 0;
              }
              xmlValidatePushElement(lVar32,pxVar37,pxVar36,uVar49);
              call_tests = call_tests + 1;
              iVar27 = extraout_EDX_34;
              if (lVar32 != 0) {
                xmlFreeValidCtxt(lVar32);
                iVar27 = extraout_EDX_35;
              }
              if (((pxVar37 != (xmlDocPtr)0x0) && (api_doc != pxVar37)) && (pxVar37->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar37);
                iVar27 = extraout_EDX_36;
              }
              des_xmlNodePtr(iVar28,(xmlNodePtr)pxVar36,iVar27);
              xmlResetLastError();
              iVar27 = xmlMemBlocks();
              if (iVar26 != iVar27) {
                iVar27 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlValidatePushElement",
                       (ulong)(uint)(iVar27 - iVar26));
                iVar25 = iVar25 + 1;
                printf(" %d",_test_ret_4);
                printf(" %d",(ulong)uVar44);
                printf(" %d",uVar29);
                printf(" %d");
                putchar(10);
                pxVar36 = pxVar31;
              }
              uVar7 = uVar7 + 1;
              pxVar31 = (xmlDocPtr)(ulong)uVar7;
              puVar41 = puVar41 + 1;
            } while (uVar7 != 5);
            uVar29 = (ulong)(iVar28 + 1U);
          } while (iVar28 + 1U != 3);
          uVar44 = uVar44 + 1;
        } while (uVar44 != 4);
        bVar52 = test_ret_4 == 0;
        _test_ret_4 = (ulong)(test_ret_4 + 1);
      } while (bVar52);
      function_tests = function_tests + 1;
      iVar26 = 0;
      uVar44 = 0;
      do {
        uVar7 = 0;
        do {
          iVar28 = (int)pxVar36;
          iVar27 = xmlMemBlocks();
          if (uVar44 == 0) {
            lVar32 = xmlNewValidCtxt();
          }
          else {
            lVar32 = 0;
          }
          pxVar31 = gen_xmlDocPtr(uVar7,iVar28);
          pxVar36 = pxVar31;
          xmlValidateRoot(lVar32);
          call_tests = call_tests + 1;
          if (lVar32 != 0) {
            xmlFreeValidCtxt(lVar32);
          }
          if (((pxVar31 != (xmlDocPtr)0x0) && (api_doc != pxVar31)) && (pxVar31->doc != api_doc)) {
            xmlFreeDoc(pxVar31);
          }
          xmlResetLastError();
          iVar28 = xmlMemBlocks();
          if (iVar27 != iVar28) {
            iVar28 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidateRoot",(ulong)(uint)(iVar28 - iVar27));
            iVar26 = iVar26 + 1;
            printf(" %d",(ulong)uVar44);
            pxVar36 = (xmlDocPtr)(ulong)uVar7;
            printf(" %d");
            putchar(10);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != 4);
        bVar52 = uVar44 == 0;
        uVar44 = uVar44 + 1;
      } while (bVar52);
      function_tests = function_tests + 1;
      uVar44 = iVar9 + iVar4 + iVar8 + iVar3 + iVar45 + iVar10 + iVar11 + iVar12 + iVar13 + iVar14 +
               iVar15 + iVar16 + iVar17 + iVar18 + iVar19 + test_ret_19 + iVar20 + iVar21 +
               test_ret_40 + iVar22 + iVar23 + iVar24 + iVar25 + iVar26;
      if (uVar44 != 0) {
        printf("Module valid: %d errors\n",(ulong)uVar44);
      }
      return uVar44;
    }
  } while( true );
}

Assistant:

static int
test_valid(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing valid : 50 of 70 functions ...\n");
    test_ret += test_xmlAddAttributeDecl();
    test_ret += test_xmlAddElementDecl();
    test_ret += test_xmlAddID();
    test_ret += test_xmlAddNotationDecl();
    test_ret += test_xmlAddRef();
    test_ret += test_xmlCopyAttributeTable();
    test_ret += test_xmlCopyDocElementContent();
    test_ret += test_xmlCopyElementContent();
    test_ret += test_xmlCopyElementTable();
    test_ret += test_xmlCopyEnumeration();
    test_ret += test_xmlCopyNotationTable();
    test_ret += test_xmlCreateEnumeration();
    test_ret += test_xmlDumpAttributeDecl();
    test_ret += test_xmlDumpAttributeTable();
    test_ret += test_xmlDumpElementDecl();
    test_ret += test_xmlDumpElementTable();
    test_ret += test_xmlDumpNotationDecl();
    test_ret += test_xmlDumpNotationTable();
    test_ret += test_xmlGetDtdAttrDesc();
    test_ret += test_xmlGetDtdElementDesc();
    test_ret += test_xmlGetDtdNotationDesc();
    test_ret += test_xmlGetDtdQAttrDesc();
    test_ret += test_xmlGetDtdQElementDesc();
    test_ret += test_xmlGetID();
    test_ret += test_xmlGetRefs();
    test_ret += test_xmlIsID();
    test_ret += test_xmlIsMixedElement();
    test_ret += test_xmlIsRef();
    test_ret += test_xmlNewDocElementContent();
    test_ret += test_xmlNewElementContent();
    test_ret += test_xmlNewValidCtxt();
    test_ret += test_xmlRemoveID();
    test_ret += test_xmlRemoveRef();
    test_ret += test_xmlSnprintfElementContent();
    test_ret += test_xmlSprintfElementContent();
    test_ret += test_xmlValidBuildContentModel();
    test_ret += test_xmlValidCtxtNormalizeAttributeValue();
    test_ret += test_xmlValidGetPotentialChildren();
    test_ret += test_xmlValidGetValidElements();
    test_ret += test_xmlValidNormalizeAttributeValue();
    test_ret += test_xmlValidateAttributeDecl();
    test_ret += test_xmlValidateAttributeValue();
    test_ret += test_xmlValidateDocument();
    test_ret += test_xmlValidateDocumentFinal();
    test_ret += test_xmlValidateDtd();
    test_ret += test_xmlValidateDtdFinal();
    test_ret += test_xmlValidateElement();
    test_ret += test_xmlValidateElementDecl();
    test_ret += test_xmlValidateNameValue();
    test_ret += test_xmlValidateNamesValue();
    test_ret += test_xmlValidateNmtokenValue();
    test_ret += test_xmlValidateNmtokensValue();
    test_ret += test_xmlValidateNotationDecl();
    test_ret += test_xmlValidateNotationUse();
    test_ret += test_xmlValidateOneAttribute();
    test_ret += test_xmlValidateOneElement();
    test_ret += test_xmlValidateOneNamespace();
    test_ret += test_xmlValidatePopElement();
    test_ret += test_xmlValidatePushCData();
    test_ret += test_xmlValidatePushElement();
    test_ret += test_xmlValidateRoot();

    if (test_ret != 0)
	printf("Module valid: %d errors\n", test_ret);
    return(test_ret);
}